

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O0

istream * amrex::operator>>(istream *is,Mask *m)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  istream *piVar6;
  IntVect *pIVar7;
  long lVar8;
  long lVar9;
  Long LVar10;
  Box *this;
  long in_RSI;
  istream *in_RDI;
  int k;
  IntVect p;
  IntVect q;
  IntVect bg;
  IntVect sm;
  int ncomp;
  Box b;
  Long result;
  IntVect *in_stack_fffffffffffffd78;
  Box *in_stack_fffffffffffffd80;
  Arena *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  Box *in_stack_fffffffffffffda8;
  BaseFab<int> *in_stack_fffffffffffffdb0;
  long lVar11;
  Box *in_stack_fffffffffffffdb8;
  istream *in_stack_fffffffffffffdc0;
  int local_224;
  undefined8 local_220;
  int local_218;
  IntVect local_214;
  undefined8 local_208;
  int local_200;
  undefined8 local_1fc;
  int local_1f4;
  int local_1f0;
  Box local_1ec;
  long local_1d0;
  istream *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  Box *local_1a8;
  int local_19c;
  undefined8 *local_198;
  long local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined4 local_174;
  undefined8 *local_170;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  Box *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  Box *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined4 local_d4;
  undefined8 *local_d0;
  undefined4 local_c4;
  undefined8 *local_c0;
  undefined4 local_b4;
  undefined8 *local_b0;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_84;
  undefined8 *local_80;
  long local_78;
  undefined8 *local_70;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  std::istream::ignore((long)in_RDI,100000);
  Box::Box(in_stack_fffffffffffffd80);
  piVar6 = operator>>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::istream::operator>>(piVar6,&local_1f0);
  std::istream::ignore((long)local_1c8,100000);
  BaseFab<int>::resize
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
             in_stack_fffffffffffffd98);
  pIVar7 = Box::smallEnd(&local_1ec);
  local_1fc = *(undefined8 *)pIVar7->vect;
  local_1f4 = pIVar7->vect[2];
  pIVar7 = Box::bigEnd(&local_1ec);
  local_208 = *(undefined8 *)pIVar7->vect;
  local_200 = pIVar7->vect[2];
  IntVect::IntVect(&local_214);
  local_220 = local_1fc;
  local_218 = local_1f4;
  while( true ) {
    local_1b8 = &local_220;
    local_1c0 = &local_208;
    local_134 = 2;
    bVar1 = true;
    if (local_218 <= local_200) {
      local_144 = 2;
      bVar1 = false;
      local_140 = local_1b8;
      if (local_200 == local_218) {
        local_154 = 1;
        bVar1 = true;
        local_150 = local_1b8;
        if (local_220._4_4_ <= local_208._4_4_) {
          local_164 = 1;
          bVar1 = false;
          local_160 = local_1b8;
          if (local_208._4_4_ == local_220._4_4_) {
            local_174 = 0;
            bVar1 = (int)local_208 < (int)local_220;
            local_170 = local_1b8;
          }
        }
      }
    }
    local_188 = local_1b8;
    local_180 = local_1c0;
    local_130 = local_1b8;
    if (bVar1) break;
    operator>>((istream *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    for (local_224 = 0; lVar8 = local_1d0, local_224 < local_1f0; local_224 = local_224 + 1) {
      local_190 = local_1d0;
      local_198 = &local_220;
      local_19c = local_224;
      lVar11 = *(long *)(local_1d0 + 0x10);
      this = (Box *)(local_1d0 + 0x18);
      local_c = 0;
      local_1c = 0;
      local_78 = (long)((int)local_220 - (this->smallend).vect[0]);
      piVar6 = local_1c8;
      local_70 = local_198;
      local_68 = this;
      local_18 = this;
      local_8 = local_198;
      iVar2 = Box::length(this,0);
      local_28 = local_70;
      local_2c = 1;
      local_3c = 1;
      iVar3 = *(int *)((long)local_70 + 4) - *(int *)(lVar8 + 0x1c);
      local_48 = local_70;
      local_4c = 2;
      local_5c = 2;
      iVar4 = *(int *)(local_70 + 1) - *(int *)(lVar8 + 0x20);
      local_58 = this;
      local_38 = this;
      iVar5 = Box::length(this,1);
      lVar8 = iVar2 * (iVar3 + iVar4 * iVar5) + local_78;
      lVar9 = (long)local_19c;
      local_78 = lVar8;
      LVar10 = Box::numPts((Box *)CONCAT44(iVar3,iVar4));
      std::istream::operator>>(piVar6,(int *)(lVar11 + (lVar8 + lVar9 * LVar10) * 4));
    }
    std::istream::ignore((long)local_1c8,100000);
    in_stack_fffffffffffffd80 = &local_1ec;
    local_1b0 = &local_220;
    local_84 = 0;
    local_94 = 0;
    local_f0 = &local_1ec.bigend;
    local_f4 = 0;
    local_1a8 = in_stack_fffffffffffffd80;
    local_90 = local_1b0;
    local_80 = local_1b0;
    if (local_1ec.bigend.vect[0] < (int)local_220 + 1) {
      local_104 = 0;
      local_a4 = 0;
      local_b4 = 1;
      local_c4 = 1;
      local_110 = &local_1ec.bigend;
      local_114 = 1;
      local_100 = in_stack_fffffffffffffd80;
      local_c0 = local_1b0;
      local_b0 = local_1b0;
      local_a0 = local_1b0;
      if (local_1ec.bigend.vect[1] < (int)((ulong)local_220 >> 0x20) + 1) {
        local_124 = 1;
        local_d4 = 1;
        local_e4 = 2;
        local_120 = in_stack_fffffffffffffd80;
        local_e0 = local_1b0;
        local_d0 = local_1b0;
      }
    }
  }
  std::istream::ignore((long)local_1c8,100000);
  return local_1c8;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            Mask&         m)
{
    is.ignore(BL_IGNORE_MAX,':');
    Box b;
    int ncomp;
    is >> b >> ncomp;
    is.ignore(BL_IGNORE_MAX, '\n');
    m.resize(b,ncomp);
    IntVect sm = b.smallEnd();
    IntVect bg = b.bigEnd();
    IntVect q;
    for (IntVect p = sm; p <= bg; b.next(p))
    {
        is >> q;
        BL_ASSERT( p == q);
        for( int k=0; k<ncomp; k++ ) is >> m(p,k);
        is.ignore(BL_IGNORE_MAX, '\n');
    }
    is.ignore(BL_IGNORE_MAX,'\n');
    BL_ASSERT(is.good());
    return is;
}